

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_setup(mbedtls_pk_context *ctx,mbedtls_pk_info_t *info)

{
  void *pvVar1;
  mbedtls_pk_info_t *info_local;
  mbedtls_pk_context *ctx_local;
  
  if (((ctx == (mbedtls_pk_context *)0x0) || (info == (mbedtls_pk_info_t *)0x0)) ||
     (ctx->pk_info != (mbedtls_pk_info_t *)0x0)) {
    ctx_local._4_4_ = -16000;
  }
  else {
    pvVar1 = (*info->ctx_alloc_func)();
    ctx->pk_ctx = pvVar1;
    if (pvVar1 == (void *)0x0) {
      ctx_local._4_4_ = -0x3f80;
    }
    else {
      ctx->pk_info = info;
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_setup( mbedtls_pk_context *ctx, const mbedtls_pk_info_t *info )
{
    if( ctx == NULL || info == NULL || ctx->pk_info != NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ( ctx->pk_ctx = info->ctx_alloc_func() ) == NULL )
        return( MBEDTLS_ERR_PK_ALLOC_FAILED );

    ctx->pk_info = info;

    return( 0 );
}